

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

ncnn_layer_t ncnn_layer_create_by_typeindex(int typeindex)

{
  ncnn_layer_t p_Var1;
  Layer *pLVar2;
  int in_EDI;
  ncnn_layer_t layer;
  
  p_Var1 = (ncnn_layer_t)malloc(0x48);
  pLVar2 = ncnn::create_layer(in_EDI);
  p_Var1->pthis = pLVar2;
  p_Var1->load_param = __ncnn_layer_load_param;
  p_Var1->load_model = __ncnn_layer_load_model;
  p_Var1->create_pipeline = __ncnn_layer_create_pipeline;
  p_Var1->destroy_pipeline = __ncnn_layer_destroy_pipeline;
  p_Var1->forward_1 = __ncnn_layer_forward_1;
  p_Var1->forward_n = __ncnn_layer_forward_n;
  p_Var1->forward_inplace_1 = __ncnn_layer_forward_inplace_1;
  p_Var1->forward_inplace_n = __ncnn_layer_forward_inplace_n;
  return p_Var1;
}

Assistant:

ncnn_layer_t ncnn_layer_create_by_typeindex(int typeindex)
{
    ncnn_layer_t layer = (ncnn_layer_t)malloc(sizeof(__ncnn_layer_t));
    layer->pthis = (void*)(ncnn::create_layer(typeindex));
    layer->load_param = __ncnn_layer_load_param;
    layer->load_model = __ncnn_layer_load_model;
    layer->create_pipeline = __ncnn_layer_create_pipeline;
    layer->destroy_pipeline = __ncnn_layer_destroy_pipeline;
    layer->forward_1 = __ncnn_layer_forward_1;
    layer->forward_n = __ncnn_layer_forward_n;
    layer->forward_inplace_1 = __ncnn_layer_forward_inplace_1;
    layer->forward_inplace_n = __ncnn_layer_forward_inplace_n;
    return layer;
}